

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<capnp::schema::Node::SourceInfo::Reader> * __thiscall
capnp::compiler::Compiler::getSourceInfo
          (Maybe<capnp::schema::Node::SourceInfo::Reader> *__return_storage_ptr__,Compiler *this,
          uint64_t id)

{
  kj::_::Mutex::lock(&(this->impl).mutex,0);
  Impl::getSourceInfo(__return_storage_ptr__,(this->impl).value.ptr,id);
  kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Node::SourceInfo::Reader> Compiler::getSourceInfo(uint64_t id) const {
  return impl.lockExclusive()->get()->getSourceInfo(id);
}